

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::Reflection::GetRepeatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  bool bVar1;
  uint32_t uVar2;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *this_01;
  MessageLite *pMVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *pVVar4;
  char *description;
  Descriptor *expected;
  Metadata MVar5;
  
  MVar5 = Message::GetMetadata(message);
  if (MVar5.reflection == this) {
    expected = this->descriptor_;
    if (field->containing_type_ == expected) {
      if (0xbf < (byte)field->field_0x1) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (expected,field,"GetRepeatedMessage",CPPTYPE_MESSAGE);
        }
        if ((field->field_0x1 & 8) == 0) {
          bVar1 = FieldDescriptor::is_map(field);
          if (bVar1) {
            this_00 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
            this_01 = internal::MapFieldBase::GetRepeatedField(this_00);
          }
          else {
            this_01 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
          }
          pVVar4 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                             (this_01,index);
          return pVVar4;
        }
        uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        pMVar3 = internal::ExtensionSet::GetRepeatedMessage
                           ((ExtensionSet *)
                            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                            field->number_,index);
        return (Message *)pMVar3;
      }
      description = "Field is singular; the method requires a repeated field.";
      goto LAB_0024e5b1;
    }
  }
  else {
    expected = this->descriptor_;
    MVar5 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (expected,MVar5.descriptor,field,"GetRepeatedMessage");
  }
  description = "Field does not match message type.";
LAB_0024e5b1:
  anon_unknown_6::ReportReflectionUsageError(expected,field,"GetRepeatedMessage",description);
}

Assistant:

const Message& Reflection::GetRepeatedMessage(const Message& message,
                                              const FieldDescriptor* field,
                                              int index) const {
  USAGE_CHECK_ALL(GetRepeatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<const Message&>(
        GetExtensionSet(message).GetRepeatedMessage(field->number(), index));
  } else {
    if (IsMapFieldInApi(field)) {
      return GetRaw<MapFieldBase>(message, field)
          .GetRepeatedField()
          .Get<GenericTypeHandler<Message> >(index);
    } else {
      return GetRaw<RepeatedPtrFieldBase>(message, field)
          .Get<GenericTypeHandler<Message> >(index);
    }
  }
}